

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void dLog(uint indent,char *format,...)

{
  undefined1 *puVar1;
  char in_AL;
  __va_list_tag *in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [16];
  undefined8 local_128;
  __va_list_tag *local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  char local_88 [8];
  va_list args;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  args[0].overflow_arg_area = local_138;
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  args[0]._0_8_ = &stack0x00000008;
  local_88[0] = '\x10';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct((ulong)local_48,(char)indent * '\x02');
  puVar1 = local_48[0];
  chatra::formatTextV_abi_cxx11_(&local_68,(chatra *)format,local_88,in_RCX);
  printf("%s%s\n",puVar1,local_68._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  fflush(_stdout);
  return;
}

Assistant:

static void dLog(unsigned indent, const char* format, ...) {
	va_list args;
	va_start(args, format);
	std::printf("%s%s\n", std::string(indent * 2, ' ').data(), cha::formatTextV(format, args).data());
	std::fflush(stdout);
	va_end(args);
}